

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

Frame * __thiscall Frame::prepend(Frame *this,void *data,size_t size)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  pointer __p;
  size_t sVar2;
  ulong uVar3;
  uint8_t *__dest;
  
  _Var1._M_head_impl =
       (this->m_Data)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  uVar3 = (long)this->m_Pos - (long)_Var1._M_head_impl;
  if (uVar3 < size) {
    sVar2 = this->m_Size;
    __p = (pointer)operator_new__(size + sVar2);
    this->m_Pos = __p + uVar3 + size;
    memcpy(__p + uVar3 + size,_Var1._M_head_impl + uVar3,sVar2 - uVar3);
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)this,__p);
    sVar2 = this->m_Size + size;
    this->m_Size = sVar2;
    this->m_OriginalSize = sVar2;
    __dest = (this->m_Data)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar3;
  }
  else {
    __dest = this->m_Pos + -size;
  }
  this->m_Pos = __dest;
  memcpy(__dest,data,size);
  return this;
}

Assistant:

Frame& Frame::prepend(const void* const data, const size_t size)
{
    const size_t bytesFree = m_Pos - m_Data.get();
    if (size > bytesFree) {
        auto newData = new uint8_t[size + m_Size];

        m_Pos = newData + bytesFree + size;
        memcpy(m_Pos, m_Data.get() + bytesFree, m_Size - bytesFree);
        m_Data.reset(newData);
        m_Size += size;
        m_OriginalSize = m_Size;
        m_Pos = m_Data.get() + bytesFree;
    } else {
        m_Pos -= size;
    }
    memcpy(m_Pos, data, size);
    return *this;
}